

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GC.cpp
# Opt level: O2

void __thiscall luna::GC::~GC(GC *this)

{
  DestroyGeneration(this,&this->gen0_);
  DestroyGeneration(this,&this->gen1_);
  DestroyGeneration(this,&this->gen2_);
  std::ofstream::~ofstream(&this->log_stream_);
  std::_Function_base::~_Function_base(&(this->obj_deleter_).super__Function_base);
  std::_Deque_base<luna::GCObject_*,_std::allocator<luna::GCObject_*>_>::~_Deque_base
            (&(this->barriered_).
              super__Deque_base<luna::GCObject_*,_std::allocator<luna::GCObject_*>_>);
  std::_Function_base::~_Function_base(&(this->major_traveller_).super__Function_base);
  std::_Function_base::~_Function_base(&(this->minor_traveller_).super__Function_base);
  return;
}

Assistant:

GC::~GC()
    {
        DestroyGeneration(gen0_);
        DestroyGeneration(gen1_);
        DestroyGeneration(gen2_);
    }